

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void TableSetupColumnFlags
               (ImGuiTable *table,ImGuiTableColumn *column,ImGuiTableColumnFlags flags_in)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ImGuiTableColumnFlags flags;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  
  if ((flags_in & 0x18U) == 0) {
    uVar4 = table->Flags & 0xe000;
    if (((short)uVar4 == 0x4000) || (uVar4 == 0x2000)) {
      flags_in = flags_in | 0x10;
    }
    else {
      flags_in = flags_in | 8;
    }
  }
  uVar2 = (~table->Flags & 1U) << 5 | flags_in;
  uVar4 = uVar2 | 0x200;
  if ((~flags_in & 0xc00U) != 0) {
    uVar4 = uVar2;
  }
  if ((uVar4 & 0x30000) == 0) {
    uVar4 = uVar4 + (uint)((int)(((long)column - (long)(table->Columns).Data) / 0x70) != 0) *
                    0x10000 + 0x10000;
  }
  column->Flags = column->Flags & 0xf000000U | uVar4;
  column->SortDirectionsAvailList = '\0';
  bVar1 = column->field_0x6d & 3;
  column->field_0x6d = bVar1;
  if ((table->Flags & 8U) != 0) {
    bVar8 = (uVar4 & 0x4400) == 0x4000;
    bVar3 = 8;
    if (!bVar8) {
      bVar3 = 2;
    }
    uVar5 = uVar4 & 0x8800;
    bVar7 = bVar8 * '\x02' + 4;
    uVar2 = bVar8 + 1;
    if (uVar5 != 0x8000) {
      bVar7 = bVar8 * '\x02';
      uVar2 = (uint)bVar8;
    }
    bVar6 = 0;
    if (uVar5 == 0x8000) {
      bVar6 = bVar3;
    }
    bVar6 = bVar6 | bVar8;
    if ((uVar4 & 0x4400) == 0) {
      bVar7 = bVar7 | 2;
      bVar6 = bVar6 | (byte)(1 << uVar2 * 2);
      uVar2 = uVar2 + 1;
    }
    if (uVar5 == 0) {
      bVar7 = bVar7 | 4;
      bVar6 = bVar6 | (byte)(2 << (char)uVar2 * '\x02');
      uVar2 = uVar2 + 1;
    }
    bVar3 = uVar2 == 0 | (byte)((uint)table->Flags >> 0x1b) & 1;
    column->SortDirectionsAvailList = bVar6;
    column->field_0x6d = ((char)uVar2 + bVar3) * '\x04' & 0xc | (bVar3 | bVar7) << 4 | bVar1;
    ImGui::TableFixColumnSortDirection(table,column);
    return;
  }
  return;
}

Assistant:

static void TableSetupColumnFlags(ImGuiTable* table, ImGuiTableColumn* column, ImGuiTableColumnFlags flags_in)
{
    ImGuiTableColumnFlags flags = flags_in;

    // Sizing Policy
    if ((flags & ImGuiTableColumnFlags_WidthMask_) == 0)
    {
        const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
        if (table_sizing_policy == ImGuiTableFlags_SizingFixedFit || table_sizing_policy == ImGuiTableFlags_SizingFixedSame)
            flags |= ImGuiTableColumnFlags_WidthFixed;
        else
            flags |= ImGuiTableColumnFlags_WidthStretch;
    }
    else
    {
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_WidthMask_)); // Check that only 1 of each set is used.
    }

    // Resize
    if ((table->Flags & ImGuiTableFlags_Resizable) == 0)
        flags |= ImGuiTableColumnFlags_NoResize;

    // Sorting
    if ((flags & ImGuiTableColumnFlags_NoSortAscending) && (flags & ImGuiTableColumnFlags_NoSortDescending))
        flags |= ImGuiTableColumnFlags_NoSort;

    // Indentation
    if ((flags & ImGuiTableColumnFlags_IndentMask_) == 0)
        flags |= (table->Columns.index_from_ptr(column) == 0) ? ImGuiTableColumnFlags_IndentEnable : ImGuiTableColumnFlags_IndentDisable;

    // Alignment
    //if ((flags & ImGuiTableColumnFlags_AlignMask_) == 0)
    //    flags |= ImGuiTableColumnFlags_AlignCenter;
    //IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_AlignMask_)); // Check that only 1 of each set is used.

    // Preserve status flags
    column->Flags = flags | (column->Flags & ImGuiTableColumnFlags_StatusMask_);

    // Build an ordered list of available sort directions
    column->SortDirectionsAvailCount = column->SortDirectionsAvailMask = column->SortDirectionsAvailList = 0;
    if (table->Flags & ImGuiTableFlags_Sortable)
    {
        int count = 0, mask = 0, list = 0;
        if ((flags & ImGuiTableColumnFlags_PreferSortAscending)  != 0 && (flags & ImGuiTableColumnFlags_NoSortAscending)  == 0) { mask |= 1 << ImGuiSortDirection_Ascending;  list |= ImGuiSortDirection_Ascending  << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortDescending) != 0 && (flags & ImGuiTableColumnFlags_NoSortDescending) == 0) { mask |= 1 << ImGuiSortDirection_Descending; list |= ImGuiSortDirection_Descending << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortAscending)  == 0 && (flags & ImGuiTableColumnFlags_NoSortAscending)  == 0) { mask |= 1 << ImGuiSortDirection_Ascending;  list |= ImGuiSortDirection_Ascending  << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortDescending) == 0 && (flags & ImGuiTableColumnFlags_NoSortDescending) == 0) { mask |= 1 << ImGuiSortDirection_Descending; list |= ImGuiSortDirection_Descending << (count << 1); count++; }
        if ((table->Flags & ImGuiTableFlags_SortTristate) || count == 0) { mask |= 1 << ImGuiSortDirection_None; count++; }
        column->SortDirectionsAvailList = (ImU8)list;
        column->SortDirectionsAvailMask = (ImU8)mask;
        column->SortDirectionsAvailCount = (ImU8)count;
        ImGui::TableFixColumnSortDirection(table, column);
    }
}